

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

string * __thiscall
spvtools::opt::analysis::ForwardPointer::str_abi_cxx11_
          (string *__return_storage_ptr__,ForwardPointer *this)

{
  string local_1b0 [32];
  ostringstream local_190 [8];
  ostringstream oss;
  ForwardPointer *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"forward_pointer(");
  if (this->pointer_ == (Pointer *)0x0) {
    std::ostream::operator<<(local_190,*(uint *)&(this->super_Type).field_0x24);
  }
  else {
    (*(this->pointer_->super_Type)._vptr_Type[3])(local_1b0);
    std::operator<<((ostream *)local_190,local_1b0);
    std::__cxx11::string::~string(local_1b0);
  }
  std::operator<<((ostream *)local_190,")");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ForwardPointer::str() const {
  std::ostringstream oss;
  oss << "forward_pointer(";
  if (pointer_ != nullptr) {
    oss << pointer_->str();
  } else {
    oss << target_id_;
  }
  oss << ")";
  return oss.str();
}